

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int ParseEXRHeaderFromMemory
              (EXRAttribute *customAttributes,int *numCustomAttributes,int *width,int *height,
              uchar *memory)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  pointer __src;
  pointer puVar5;
  int iVar6;
  uchar *puVar7;
  undefined8 uVar8;
  ulong uVar9;
  long lVar10;
  uchar *puVar11;
  size_t __n;
  int iVar12;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> attribs;
  string attrName;
  string attrType;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  channels;
  EXRAttribute attrib;
  undefined8 local_110;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  void *local_d8;
  iterator iStack_d0;
  _EXRAttribute *local_c8;
  string local_b8;
  string local_98;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  local_78;
  EXRAttribute *local_60;
  uchar *local_58;
  _EXRAttribute local_50;
  
  if (memory == (uchar *)0x0) {
    iVar12 = -1;
  }
  else {
    iVar12 = -3;
    if (*(int *)memory == 0x1312f76) {
      puVar11 = memory + (ulong)(*(int *)memory == 0x1312f76) * 4;
      iVar12 = -4;
      if ((((*puVar11 == '\x02') && (puVar11[1] == '\0')) && (puVar11[2] == '\0')) &&
         (puVar11[3] == '\0')) {
        local_78.
        super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.
        super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.
        super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_c8 = (_EXRAttribute *)0x0;
        local_d8 = (void *)0x0;
        iStack_d0._M_current = (_EXRAttribute *)0x0;
        if (numCustomAttributes != (int *)0x0) {
          *numCustomAttributes = 0;
        }
        puVar11 = puVar11 + 4;
        iVar12 = -3;
        local_e0 = -1;
        local_ec = -1;
        local_e4 = -1;
        local_e8 = -1;
        local_dc = -1;
        local_60 = customAttributes;
        do {
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          local_b8._M_string_length = 0;
          local_b8.field_2._M_local_buf[0] = '\0';
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          local_98._M_string_length = 0;
          local_98.field_2._M_local_buf[0] = '\0';
          local_110 = 0;
          local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (byte *)0x0;
          local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (byte *)0x0;
          puVar7 = (uchar *)anon_unknown.dwarf_1096b8::ReadAttribute
                                      (&local_b8,&local_98,&local_108,(char *)puVar11);
          if (puVar7 == (uchar *)0x0) {
            puVar11 = puVar11 + 1;
            iVar6 = 2;
          }
          else {
            local_58 = puVar7;
            iVar6 = std::__cxx11::string::compare((char *)&local_b8);
            if (iVar6 == 0) {
              if (4 < *local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start) {
                iVar12 = -5;
LAB_0013ffc4:
                iVar6 = 1;
                goto LAB_00140065;
              }
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)&local_b8);
              if (iVar6 == 0) {
                anon_unknown.dwarf_1096b8::ReadChannelInfo(&local_78,&local_108);
                local_dc = (int)((ulong)((long)local_78.
                                               super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_78.
                                              super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                           -0x55555555;
                if (local_dc < 1) {
                  iVar12 = -6;
                  goto LAB_0013ffc4;
                }
              }
              else {
                iVar6 = std::__cxx11::string::compare((char *)&local_b8);
                if (iVar6 == 0) {
                  uVar9 = (long)local_108.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_108.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                  if (uVar9 == 0) goto LAB_001401e2;
                  if (uVar9 < 5) {
LAB_001401ca:
                    local_110 = 4;
                    goto LAB_001401e2;
                  }
                  if (uVar9 < 9) {
LAB_001401d1:
                    local_110 = 8;
                    goto LAB_001401e2;
                  }
                  if (uVar9 < 0xd) {
LAB_001401d8:
                    local_110 = 0xc;
                    goto LAB_001401e2;
                  }
                  local_e0 = *(int *)local_108.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                  local_ec = *(int *)(local_108.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 4);
                  local_e4 = *(int *)(local_108.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 8);
                  local_e8 = *(int *)(local_108.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 0xc);
                }
                else {
                  iVar6 = std::__cxx11::string::compare((char *)&local_b8);
                  if (iVar6 == 0) {
                    uVar9 = (long)local_108.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_108.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                    if (uVar9 == 0) goto LAB_001401e2;
                    if (uVar9 < 5) goto LAB_001401ca;
                    if (uVar9 < 9) goto LAB_001401d1;
                    if (uVar9 < 0xd) goto LAB_001401d8;
                  }
                  else {
                    iVar6 = std::__cxx11::string::compare((char *)&local_b8);
                    if ((iVar6 == 0) ||
                       (iVar6 = std::__cxx11::string::compare((char *)&local_b8), iVar6 == 0)) {
LAB_0014001c:
                      if (local_108.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish ==
                          local_108.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start) {
                        do {
                          uVar9 = 0;
LAB_001401e2:
                          std::__throw_out_of_range_fmt
                                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                     ,local_110,uVar9);
                        } while( true );
                      }
                    }
                    else {
                      iVar6 = std::__cxx11::string::compare((char *)&local_b8);
                      if (iVar6 == 0) {
                        uVar9 = (long)local_108.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_108.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                        if (uVar9 == 0) goto LAB_001401e2;
                        if (uVar9 < 5) goto LAB_001401ca;
                      }
                      else {
                        iVar6 = std::__cxx11::string::compare((char *)&local_b8);
                        if (iVar6 == 0) goto LAB_0014001c;
                        if ((numCustomAttributes != (int *)0x0) && (*numCustomAttributes < 0x80)) {
                          puts("custom");
                          local_50.name = strdup(local_b8._M_dataplus._M_p);
                          local_50.type = strdup(local_98._M_dataplus._M_p);
                          puVar5 = local_108.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                          __src = local_108.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                          local_50.size =
                               (int)((long)local_108.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_108.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                          local_50.value =
                               (uchar *)malloc((long)local_108.
                                                                                                          
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)local_108.
                                                                                                          
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          __n = (long)puVar5 - (long)__src;
                          if (__n == 0) {
                            uVar8 = std::__throw_out_of_range_fmt
                                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                               ,0,0);
                            if (local_108.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start != (byte *)0x0) {
                              operator_delete(local_108.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
                              operator_delete(local_98._M_dataplus._M_p);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                              operator_delete(local_b8._M_dataplus._M_p);
                            }
                            if (local_d8 != (void *)0x0) {
                              operator_delete(local_d8);
                            }
                            std::
                            vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                            ::~vector(&local_78);
                            _Unwind_Resume(uVar8);
                          }
                          memcpy(local_50.value,__src,__n);
                          if (iStack_d0._M_current == local_c8) {
                            std::vector<_EXRAttribute,std::allocator<_EXRAttribute>>::
                            _M_realloc_insert<_EXRAttribute_const&>
                                      ((vector<_EXRAttribute,std::allocator<_EXRAttribute>> *)
                                       &local_d8,iStack_d0,&local_50);
                          }
                          else {
                            (iStack_d0._M_current)->name = local_50.name;
                            (iStack_d0._M_current)->type = local_50.type;
                            *(ulong *)&(iStack_d0._M_current)->size =
                                 CONCAT44(local_50._20_4_,local_50.size);
                            (iStack_d0._M_current)->value = local_50.value;
                            iStack_d0._M_current = iStack_d0._M_current + 1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            iVar6 = 0;
            puVar11 = local_58;
          }
LAB_00140065:
          if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (byte *)0x0) {
            operator_delete(local_108.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
        } while (iVar6 == 0);
        if (iVar6 == 2) {
          if (local_e0 < 0) {
            __assert_fail("dx >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                          ,0x22d0,
                          "int ParseEXRHeaderFromMemory(EXRAttribute *, int *, int *, int *, const unsigned char *)"
                         );
          }
          if (local_ec < 0) {
            __assert_fail("dy >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                          ,0x22d1,
                          "int ParseEXRHeaderFromMemory(EXRAttribute *, int *, int *, int *, const unsigned char *)"
                         );
          }
          if (local_e4 < 0) {
            __assert_fail("dw >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                          ,0x22d2,
                          "int ParseEXRHeaderFromMemory(EXRAttribute *, int *, int *, int *, const unsigned char *)"
                         );
          }
          if (local_e8 < 0) {
            __assert_fail("dh >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                          ,0x22d3,
                          "int ParseEXRHeaderFromMemory(EXRAttribute *, int *, int *, int *, const unsigned char *)"
                         );
          }
          if (local_dc < 1) {
            __assert_fail("numChannels >= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                          ,0x22d4,
                          "int ParseEXRHeaderFromMemory(EXRAttribute *, int *, int *, int *, const unsigned char *)"
                         );
          }
          iVar12 = 0;
          *width = (local_e4 - local_e0) + 1;
          *height = (local_e8 - local_ec) + 1;
          if (numCustomAttributes != (int *)0x0) {
            uVar9 = (long)iStack_d0._M_current - (long)local_d8 >> 5;
            if (0x7f < uVar9) {
              __assert_fail("attribs.size() < TINYEXR_MAX_ATTRIBUTES",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                            ,0x22dd,
                            "int ParseEXRHeaderFromMemory(EXRAttribute *, int *, int *, int *, const unsigned char *)"
                           );
            }
            *numCustomAttributes = (int)uVar9;
            if (0 < (int)uVar9) {
              iVar12 = 0;
              lVar10 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_d8 + lVar10);
                uVar8 = puVar1[1];
                uVar3 = puVar1[2];
                uVar4 = puVar1[3];
                puVar2 = (undefined8 *)((long)&local_60->name + lVar10);
                *puVar2 = *puVar1;
                puVar2[1] = uVar8;
                puVar2[2] = uVar3;
                puVar2[3] = uVar4;
                lVar10 = lVar10 + 0x20;
                uVar9 = uVar9 - 1;
              } while (uVar9 != 0);
            }
          }
        }
        if (local_d8 != (void *)0x0) {
          operator_delete(local_d8);
        }
        std::
        vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
        ::~vector(&local_78);
      }
    }
  }
  return iVar12;
}

Assistant:

int ParseEXRHeaderFromMemory(EXRAttribute* customAttributes, int *numCustomAttributes, int *width, int *height,
                             const unsigned char *memory) {

  if (memory == NULL) {
    // Invalid argument
    return -1;
  }

  const char *buf = reinterpret_cast<const char *>(memory);

  const char *marker = &buf[0];

  // Header check.
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};

    if (memcmp(marker, header, 4) != 0) {
      // if (err) {
      //  (*err) = "Header mismatch.";
      //}
      return -3;
    }
    marker += 4;
  }

  // Version, scanline.
  {
    // must be [2, 0, 0, 0]
    if (marker[0] != 2 || marker[1] != 0 || marker[2] != 0 || marker[3] != 0) {
      // if (err) {
      //  (*err) = "Unsupported version or scanline.";
      //}
      return -4;
    }

    marker += 4;
  }

  int dx = -1;
  int dy = -1;
  int dw = -1;
  int dh = -1;
  int lineOrder = 0; // @fixme
  int displayWindow[4] = {-1, -1, -1, -1}; // @fixme
  float screenWindowCenter[2] = {0.0f, 0.0f}; // @fixme
  float screenWindowWidth = 1.0f; // @fixme
  int numChannels = -1;
  float pixelAspectRatio = 1.0f; // @fixme
  std::vector<ChannelInfo> channels;
  std::vector<EXRAttribute> attribs;

  if (numCustomAttributes) {
    (*numCustomAttributes) = 0;
  }

  // Read attributes
  for (;;) {
    std::string attrName;
    std::string attrType;
    std::vector<unsigned char> data;
    const char *marker_next = ReadAttribute(attrName, attrType, data, marker);
    if (marker_next == NULL) {
      marker++; // skip '\0'
      break;
    }

    if (attrName.compare("compression") == 0) {
      // must be 0:No compression, 1: RLE or 3: ZIP
      //      if (data[0] != 0 && data[0] != 1 && data[0] != 3) {

      //	mwkm
      //	0 : NO_COMPRESSION
      //	1 : RLE
      //	2 : ZIPS (Single scanline)
      //	3 : ZIP (16-line block)
      //	4 : PIZ (32-line block)
      if (data[0] > 4) {
        // if (err) {
        //  (*err) = "Unsupported compression type.";
        //}
        return -5;
      }

    } else if (attrName.compare("channels") == 0) {

      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      ReadChannelInfo(channels, data);

      numChannels = channels.size();

      if (numChannels < 1) {
        // if (err) {
        //  (*err) = "Invalid channels format.";
        //}
        return -6;
      }

    } else if (attrName.compare("dataWindow") == 0) {
      memcpy(&dx, &data.at(0), sizeof(int));
      memcpy(&dy, &data.at(4), sizeof(int));
      memcpy(&dw, &data.at(8), sizeof(int));
      memcpy(&dh, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&dx));
        swap4(reinterpret_cast<unsigned int *>(&dy));
        swap4(reinterpret_cast<unsigned int *>(&dw));
        swap4(reinterpret_cast<unsigned int *>(&dh));
      }
    } else if (attrName.compare("displayWindow") == 0) {
      memcpy(&displayWindow[0], &data.at(0), sizeof(int));
      memcpy(&displayWindow[1], &data.at(4), sizeof(int));
      memcpy(&displayWindow[2], &data.at(8), sizeof(int));
      memcpy(&displayWindow[3], &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[0]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[1]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[2]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[3]));
      }
    } else if (attrName.compare("lineOrder") == 0) {
      memcpy(&lineOrder, &data.at(0), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&lineOrder));
      }
    } else if (attrName.compare("pixelAspectRatio") == 0) {
      memcpy(&pixelAspectRatio, &data.at(0), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&pixelAspectRatio));
      }
    } else if (attrName.compare("screenWindowCenter") == 0) {
      memcpy(&screenWindowCenter[0], &data.at(0), sizeof(float));
      memcpy(&screenWindowCenter[1], &data.at(4), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&screenWindowCenter[0]));
        swap4(reinterpret_cast<unsigned int *>(&screenWindowCenter[1]));
      }
    } else if (attrName.compare("screenWindowWidth") == 0) {
      memcpy(&screenWindowWidth, &data.at(0), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&screenWindowWidth));
      }
      
    } else {
      // Custom attribute(up to TINYEXR_MAX_ATTRIBUTES)
      if (numCustomAttributes && ((*numCustomAttributes) < TINYEXR_MAX_ATTRIBUTES)) {
        printf("custom\n");
        EXRAttribute attrib;
        attrib.name = strdup(attrName.c_str());
        attrib.type = strdup(attrType.c_str());
        attrib.size = data.size();
        attrib.value = (unsigned char*)malloc(data.size());
        memcpy((char*)attrib.value, &data.at(0), data.size());
        attribs.push_back(attrib);
      }
    }

    marker = marker_next;
  }

  assert(dx >= 0);
  assert(dy >= 0);
  assert(dw >= 0);
  assert(dh >= 0);
  assert(numChannels >= 1);

  int dataWidth = dw - dx + 1;
  int dataHeight = dh - dy + 1;

  (*width) = dataWidth;
  (*height) = dataHeight;

  if (numCustomAttributes) {
    assert(attribs.size() < TINYEXR_MAX_ATTRIBUTES);
    (*numCustomAttributes) = attribs.size();

    // Assume the pointer to customAttributes has enough memory to store.
    for (int i = 0; i < (int)attribs.size(); i++) {
      customAttributes[i] = attribs[i];
    }
  } 

  return 0;
}